

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON__UINT32 __thiscall
ON_WindingNumber::AddBoundary
          (ON_WindingNumber *this,size_t point_count,size_t point_stride,int *boundary_points,
          bool bCloseBoundary)

{
  ON__UINT32 OVar1;
  bool bVar2;
  int *local_60;
  int *p;
  int *pmax;
  ON_2dPoint p1;
  ON_2dPoint p0;
  ON__UINT32 boundary_segment_count0;
  bool bCloseBoundary_local;
  int *boundary_points_local;
  size_t point_stride_local;
  size_t point_count_local;
  ON_WindingNumber *this_local;
  
  OVar1 = this->m_boundary_segment_count;
  bVar2 = Internal_HaveWindingPoint(this);
  if ((((bVar2) && (1 < point_count)) && (1 < point_stride)) && (boundary_points != (int *)0x0)) {
    pmax = (int *)(double)*boundary_points;
    p1.x = (double)boundary_points[1];
    for (local_60 = boundary_points + point_stride;
        local_60 < boundary_points + point_count * point_stride; local_60 = local_60 + point_stride)
    {
      p1.y = (double)pmax;
      pmax = (int *)(double)*local_60;
      p1.x = (double)local_60[1];
      Internal_AddBoundarySegment(this,&p1.y,(double *)&pmax);
    }
    if (bCloseBoundary) {
      p1.y = (double)*boundary_points;
      Internal_AddBoundarySegment(this,(double *)&pmax,&p1.y);
    }
  }
  return this->m_boundary_segment_count - OVar1;
}

Assistant:

ON__UINT32 ON_WindingNumber::AddBoundary(size_t point_count, size_t point_stride, const int* boundary_points, bool bCloseBoundary)
{
  const ON__UINT32 boundary_segment_count0 = m_boundary_segment_count;
  if (Internal_HaveWindingPoint() && point_count >= 2 && point_stride >= 2 && nullptr != boundary_points)
  {
    ON_2dPoint p0, p1;
    const int* pmax = boundary_points + (point_count*point_stride);
    p1.x = boundary_points[0];
    p1.y = boundary_points[1];
    for (const int* p = boundary_points+point_stride; p < pmax; p += point_stride)
    {
      p0 = p1;
      p1.x = p[0];
      p1.y = p[1];
      Internal_AddBoundarySegment(&p0.x, &p1.x);
    }
    if (bCloseBoundary)
    {
      p0.x = boundary_points[0];
      p0.y = boundary_points[1];
      Internal_AddBoundarySegment(&p1.x, &p0.x);
    }
  }
  return (m_boundary_segment_count - boundary_segment_count0);
}